

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_utils_basis.h
# Opt level: O1

float __thiscall
ktx::OptionsEncodeBasis<false>::captureCodecOption<float>
          (OptionsEncodeBasis<false> *this,ParseResult *args,char *name)

{
  float fVar1;
  OptionValue *this_00;
  float *pfVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args_00;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,name,(allocator<char> *)&local_38);
  this_00 = cxxopts::ParseResult::operator[](args,&local_58);
  pfVar2 = cxxopts::OptionValue::as<float>(this_00);
  fVar1 = *pfVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58.field_2._M_allocated_capacity = (size_type)(uint)fVar1;
  fmt.size_ = 0x9c;
  fmt.data_ = (char *)0x8;
  args_00.field_1.args_ = in_R9.args_;
  args_00.desc_ = (unsigned_long_long)&local_58;
  local_58._M_dataplus._M_p = name;
  ::fmt::v10::vformat_abi_cxx11_(&local_38,(v10 *)" --{} {}",fmt,args_00);
  std::__cxx11::string::_M_append((char *)&this->codecOptions,(ulong)local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return fVar1;
}

Assistant:

T captureCodecOption(cxxopts::ParseResult& args, const char* name) {
        const T value = args[name].as<T>();
        codecOptions += fmt::format(" --{} {}", name, value);
        return value;
    }